

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_draw_buffers2(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_draw_buffers2 != 0) {
    glad_glColorMaskIndexedEXT = (PFNGLCOLORMASKINDEXEDEXTPROC)(*load)("glColorMaskIndexedEXT");
    glad_glGetBooleanIndexedvEXT =
         (PFNGLGETBOOLEANINDEXEDVEXTPROC)(*load)("glGetBooleanIndexedvEXT");
    glad_glGetIntegerIndexedvEXT =
         (PFNGLGETINTEGERINDEXEDVEXTPROC)(*load)("glGetIntegerIndexedvEXT");
    glad_glEnableIndexedEXT = (PFNGLENABLEINDEXEDEXTPROC)(*load)("glEnableIndexedEXT");
    glad_glDisableIndexedEXT = (PFNGLDISABLEINDEXEDEXTPROC)(*load)("glDisableIndexedEXT");
    glad_glIsEnabledIndexedEXT = (PFNGLISENABLEDINDEXEDEXTPROC)(*load)("glIsEnabledIndexedEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_draw_buffers2(GLADloadproc load) {
	if(!GLAD_GL_EXT_draw_buffers2) return;
	glad_glColorMaskIndexedEXT = (PFNGLCOLORMASKINDEXEDEXTPROC)load("glColorMaskIndexedEXT");
	glad_glGetBooleanIndexedvEXT = (PFNGLGETBOOLEANINDEXEDVEXTPROC)load("glGetBooleanIndexedvEXT");
	glad_glGetIntegerIndexedvEXT = (PFNGLGETINTEGERINDEXEDVEXTPROC)load("glGetIntegerIndexedvEXT");
	glad_glEnableIndexedEXT = (PFNGLENABLEINDEXEDEXTPROC)load("glEnableIndexedEXT");
	glad_glDisableIndexedEXT = (PFNGLDISABLEINDEXEDEXTPROC)load("glDisableIndexedEXT");
	glad_glIsEnabledIndexedEXT = (PFNGLISENABLEDINDEXEDEXTPROC)load("glIsEnabledIndexedEXT");
}